

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureStateQueryTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Functional::TextureStateQueryTests::init
          (TextureStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  undefined4 uVar1;
  Context *pCVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  GetTexParameterIVerifier *pGVar6;
  undefined4 extraout_var;
  TestContext *pTVar7;
  undefined4 extraout_var_00;
  ApiCase *pAVar8;
  long *plVar9;
  undefined8 uVar10;
  long *plVar11;
  bool bVar12;
  long lVar13;
  allocator<char> local_c1;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  long *local_80 [2];
  long local_70 [2];
  undefined4 local_5c;
  TestContext *local_58;
  TestContext *local_50;
  TextureStateQueryTests *local_48;
  char *local_40;
  uint local_38;
  uint local_34;
  
  pGVar6 = (GetTexParameterIVerifier *)operator_new(0x28);
  iVar4 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&(pGVar6->super_TexParamVerifier).super_CallLogWrapper,
             (Functions *)CONCAT44(extraout_var,iVar4),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  (pGVar6->super_TexParamVerifier).m_testNamePostfix = "_gettexparameteri";
  (pGVar6->super_TexParamVerifier).super_CallLogWrapper.m_enableLog = true;
  (pGVar6->super_TexParamVerifier)._vptr_TexParamVerifier =
       (_func_int **)&PTR__TexParamVerifier_02125330;
  this->m_verifierInt = pGVar6;
  pTVar7 = (TestContext *)operator_new(0x28);
  iVar4 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)&pTVar7->m_rootArchive,(Functions *)CONCAT44(extraout_var_00,iVar4),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  pTVar7->m_watchDog = (qpWatchDog *)"_gettexparameterf";
  *(undefined1 *)&pTVar7->m_cmdLine = 1;
  pTVar7->m_platform = (Platform *)&PTR__TexParamVerifier_02125360;
  this->m_verifierFloat = (GetTexParameterFVerifier *)pTVar7;
  local_58 = (TestContext *)this->m_verifierInt;
  uVar10 = CONCAT71((int7)((ulong)local_58 >> 8),1);
  lVar13 = 0;
  local_50 = pTVar7;
  local_48 = this;
  do {
    local_38 = (uint)uVar10;
    uVar5 = 0x2125301;
    pTVar7 = local_58;
    do {
      local_34 = uVar5;
      pAVar8 = (ApiCase *)operator_new(0xb0);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      local_40 = (&PTR_anon_var_dwarf_1f0513d_021253c0)[lVar13 * 2];
      std::__cxx11::string::string<std::allocator<char>>((string *)local_80,local_40,&local_c1);
      plVar9 = (long *)std::__cxx11::string::append((char *)local_80);
      local_c0 = &local_b0;
      plVar11 = plVar9 + 2;
      if ((long *)*plVar9 == plVar11) {
        local_b0 = *plVar11;
        lStack_a8 = plVar9[3];
      }
      else {
        local_b0 = *plVar11;
        local_c0 = (long *)*plVar9;
      }
      local_b8 = plVar9[1];
      *plVar9 = (long)plVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_c0);
      plVar11 = plVar9 + 2;
      if ((long *)*plVar9 == plVar11) {
        local_90 = *plVar11;
        lStack_88 = plVar9[3];
        local_a0 = &local_90;
      }
      else {
        local_90 = *plVar11;
        local_a0 = (long *)*plVar9;
      }
      local_98 = plVar9[1];
      *plVar9 = (long)plVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      uVar1 = (&DAT_021253c8)[lVar13 * 4];
      ApiCase::ApiCase(pAVar8,pCVar2,(char *)local_a0,"TEXTURE_WRAP_S");
      this = local_48;
      *(undefined4 *)&pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = uVar1;
      pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = pTVar7;
      (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_02125460;
      *(undefined4 *)&pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p
           = 0x2802;
      tcu::TestNode::addChild((TestNode *)local_48,(TestNode *)pAVar8);
      local_5c = uVar1;
      if (local_a0 != &local_90) {
        operator_delete(local_a0,local_90 + 1);
      }
      pTVar7 = local_50;
      if (local_c0 != &local_b0) {
        operator_delete(local_c0,local_b0 + 1);
      }
      if (local_80[0] != local_70) {
        operator_delete(local_80[0],local_70[0] + 1);
      }
      uVar5 = 0;
    } while ((local_34 & 1) != 0);
    pTVar7 = local_58;
    bVar3 = true;
    do {
      bVar12 = bVar3;
      pAVar8 = (ApiCase *)operator_new(0xb0);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>((string *)local_80,local_40,&local_c1);
      plVar9 = (long *)std::__cxx11::string::append((char *)local_80);
      local_c0 = &local_b0;
      plVar11 = plVar9 + 2;
      if ((long *)*plVar9 == plVar11) {
        local_b0 = *plVar11;
        lStack_a8 = plVar9[3];
      }
      else {
        local_b0 = *plVar11;
        local_c0 = (long *)*plVar9;
      }
      local_b8 = plVar9[1];
      *plVar9 = (long)plVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_c0);
      plVar11 = plVar9 + 2;
      if ((long *)*plVar9 == plVar11) {
        local_90 = *plVar11;
        lStack_88 = plVar9[3];
        local_a0 = &local_90;
      }
      else {
        local_90 = *plVar11;
        local_a0 = (long *)*plVar9;
      }
      local_98 = plVar9[1];
      *plVar9 = (long)plVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      ApiCase::ApiCase(pAVar8,pCVar2,(char *)local_a0,"TEXTURE_WRAP_T");
      this = local_48;
      *(undefined4 *)&pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           local_5c;
      pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = pTVar7;
      (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_02125460;
      *(undefined4 *)&pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p
           = 0x2803;
      tcu::TestNode::addChild((TestNode *)local_48,(TestNode *)pAVar8);
      if (local_a0 != &local_90) {
        operator_delete(local_a0,local_90 + 1);
      }
      pTVar7 = local_50;
      if (local_c0 != &local_b0) {
        operator_delete(local_c0,local_b0 + 1);
      }
      if (local_80[0] != local_70) {
        operator_delete(local_80[0],local_70[0] + 1);
      }
      bVar3 = false;
    } while (bVar12);
    pTVar7 = local_58;
    bVar3 = true;
    do {
      bVar12 = bVar3;
      pAVar8 = (ApiCase *)operator_new(0xa8);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>((string *)local_80,local_40,&local_c1);
      plVar9 = (long *)std::__cxx11::string::append((char *)local_80);
      local_c0 = &local_b0;
      plVar11 = plVar9 + 2;
      if ((long *)*plVar9 == plVar11) {
        local_b0 = *plVar11;
        lStack_a8 = plVar9[3];
      }
      else {
        local_b0 = *plVar11;
        local_c0 = (long *)*plVar9;
      }
      local_b8 = plVar9[1];
      *plVar9 = (long)plVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_c0);
      plVar11 = plVar9 + 2;
      if ((long *)*plVar9 == plVar11) {
        local_90 = *plVar11;
        lStack_88 = plVar9[3];
        local_a0 = &local_90;
      }
      else {
        local_90 = *plVar11;
        local_a0 = (long *)*plVar9;
      }
      local_98 = plVar9[1];
      *plVar9 = (long)plVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      ApiCase::ApiCase(pAVar8,pCVar2,(char *)local_a0,"TEXTURE_MAG_FILTER");
      this = local_48;
      *(undefined4 *)&pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           local_5c;
      pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = pTVar7;
      (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_021254d8;
      tcu::TestNode::addChild((TestNode *)local_48,(TestNode *)pAVar8);
      if (local_a0 != &local_90) {
        operator_delete(local_a0,local_90 + 1);
      }
      pTVar7 = local_50;
      if (local_c0 != &local_b0) {
        operator_delete(local_c0,local_b0 + 1);
      }
      if (local_80[0] != local_70) {
        operator_delete(local_80[0],local_70[0] + 1);
      }
      bVar3 = false;
    } while (bVar12);
    pTVar7 = local_58;
    bVar3 = true;
    do {
      bVar12 = bVar3;
      pAVar8 = (ApiCase *)operator_new(0xa8);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>((string *)local_80,local_40,&local_c1);
      plVar9 = (long *)std::__cxx11::string::append((char *)local_80);
      local_c0 = &local_b0;
      plVar11 = plVar9 + 2;
      if ((long *)*plVar9 == plVar11) {
        local_b0 = *plVar11;
        lStack_a8 = plVar9[3];
      }
      else {
        local_b0 = *plVar11;
        local_c0 = (long *)*plVar9;
      }
      local_b8 = plVar9[1];
      *plVar9 = (long)plVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_c0);
      plVar11 = plVar9 + 2;
      if ((long *)*plVar9 == plVar11) {
        local_90 = *plVar11;
        lStack_88 = plVar9[3];
        local_a0 = &local_90;
      }
      else {
        local_90 = *plVar11;
        local_a0 = (long *)*plVar9;
      }
      local_98 = plVar9[1];
      *plVar9 = (long)plVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      ApiCase::ApiCase(pAVar8,pCVar2,(char *)local_a0,"TEXTURE_MIN_FILTER");
      this = local_48;
      *(undefined4 *)&pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           local_5c;
      pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = pTVar7;
      (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_02125538;
      tcu::TestNode::addChild((TestNode *)local_48,(TestNode *)pAVar8);
      if (local_a0 != &local_90) {
        operator_delete(local_a0,local_90 + 1);
      }
      pTVar7 = local_50;
      if (local_c0 != &local_b0) {
        operator_delete(local_c0,local_b0 + 1);
      }
      if (local_80[0] != local_70) {
        operator_delete(local_80[0],local_70[0] + 1);
      }
      bVar3 = false;
    } while (bVar12);
    lVar13 = 1;
    uVar10 = 0;
  } while ((local_38 & 1) != 0);
  return 0;
}

Assistant:

void TextureStateQueryTests::init (void)
{
	using namespace TextureParamVerifiers;

	DE_ASSERT(m_verifierInt == DE_NULL);
	DE_ASSERT(m_verifierFloat == DE_NULL);

	m_verifierInt		= new GetTexParameterIVerifier(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierFloat		= new GetTexParameterFVerifier(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());

	TexParamVerifier* verifiers[] = {m_verifierInt, m_verifierFloat};

	const struct
	{
		const char*	name;
		GLenum		textureTarget;
	} textureTargets[] =
	{
		{ "texture_2d",			GL_TEXTURE_2D},
		{ "texture_cube_map",	GL_TEXTURE_CUBE_MAP}
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(textureTargets); ++ndx)
	{
		FOR_EACH_VERIFIER(verifiers, addChild(new TextureWrapCase		(m_context, verifier,	(std::string(textureTargets[ndx].name)	+ "_texture_wrap_s"			+ verifier->getTestNamePostfix()).c_str(), "TEXTURE_WRAP_S",		textureTargets[ndx].textureTarget, GL_TEXTURE_WRAP_S)));
		FOR_EACH_VERIFIER(verifiers, addChild(new TextureWrapCase		(m_context, verifier,	(std::string(textureTargets[ndx].name)	+ "_texture_wrap_t"			+ verifier->getTestNamePostfix()).c_str(), "TEXTURE_WRAP_T",		textureTargets[ndx].textureTarget, GL_TEXTURE_WRAP_T)));

		FOR_EACH_VERIFIER(verifiers, addChild(new TextureMagFilterCase	(m_context, verifier,	(std::string(textureTargets[ndx].name)	+ "_texture_mag_filter"		+ verifier->getTestNamePostfix()).c_str(), "TEXTURE_MAG_FILTER",	textureTargets[ndx].textureTarget)));
		FOR_EACH_VERIFIER(verifiers, addChild(new TextureMinFilterCase	(m_context, verifier,	(std::string(textureTargets[ndx].name)	+ "_texture_min_filter"		+ verifier->getTestNamePostfix()).c_str(), "TEXTURE_MIN_FILTER",	textureTargets[ndx].textureTarget)));
	}
}